

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTable::parent(QAccessibleTable *this)

{
  int iVar1;
  QAbstractItemView *pQVar2;
  char *pcVar3;
  QAccessibleInterface *pQVar4;
  QObject *pQVar5;
  
  pQVar2 = view(this);
  pQVar5 = QCoreApplication::self;
  if ((pQVar2 != (QAbstractItemView *)0x0) &&
     (pQVar2 = view(this), pQVar5 = QCoreApplication::self,
     *(long *)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              0x10) != 0)) {
    pQVar2 = view(this);
    (**(code **)**(undefined8 **)
                  (*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                             field_0x8 + 0x10))();
    pcVar3 = (char *)QMetaObject::className();
    iVar1 = qstrcmp("QComboBoxPrivateContainer",pcVar3);
    pQVar2 = view(this);
    pQVar5 = *(QObject **)
              (*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              0x10);
    if (iVar1 == 0) {
      pQVar5 = *(QObject **)(*(long *)(pQVar5 + 8) + 0x10);
    }
  }
  pQVar4 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar5);
  return pQVar4;
}

Assistant:

QAccessibleInterface *QAccessibleTable::parent() const
{
    if (view() && view()->parent()) {
        if (qstrcmp("QComboBoxPrivateContainer", view()->parent()->metaObject()->className()) == 0) {
            return QAccessible::queryAccessibleInterface(view()->parent()->parent());
        }
        return QAccessible::queryAccessibleInterface(view()->parent());
    }
    return QAccessible::queryAccessibleInterface(qApp);
}